

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3EvalTestExpr(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  Fts3Phrase *pFVar1;
  Fts3DeferredToken *pFVar2;
  Fts3Expr *pFVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  char *__dest;
  char *pcVar8;
  Fts3Expr *pFVar9;
  Fts3DeferredToken **ppFVar10;
  ulong __n;
  Fts3Expr *p;
  long lVar11;
  Fts3Expr *pFVar12;
  long in_FS_OFFSET;
  bool bVar13;
  char *p2;
  char *p1;
  char *aPoslist;
  int local_90;
  int local_8c;
  char *local_80;
  ulong local_68;
  char *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = 1;
  if (*pRc != 0) goto LAB_001cf32b;
  switch(pExpr->eType) {
  case 1:
  case 3:
    iVar7 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
    uVar6 = 0;
    if (((((iVar7 != 0) && (iVar7 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc), iVar7 != 0)) &&
         (uVar6 = 1, *pRc == 0)) && (pExpr->eType == 1)) &&
       ((pExpr->pParent == (Fts3Expr *)0x0 || (pExpr->pParent->eType != 1)))) {
      lVar11 = 0;
      pFVar9 = pExpr->pLeft;
      pFVar12 = pExpr;
      while (pFVar3 = pFVar9, pFVar3 != (Fts3Expr *)0x0) {
        lVar11 = lVar11 + (pFVar12->pRight->pPhrase->doclist).nList;
        pFVar12 = pFVar3;
        pFVar9 = pFVar3->pLeft;
      }
      iVar7 = (pFVar12->pPhrase->doclist).nList;
      iVar5 = sqlite3_initialize();
      if (iVar5 == 0) {
        pcVar8 = (char *)sqlite3Malloc((lVar11 + iVar7) * 2 + 10);
      }
      else {
        pcVar8 = (char *)0x0;
      }
      if (pcVar8 == (char *)0x0) {
        *pRc = 7;
        uVar6 = 0;
      }
      else {
        local_40 = (pFVar12->pPhrase->doclist).pList;
        pFVar9 = pFVar12->pParent;
        uVar6 = 1;
        if ((pFVar9 != (Fts3Expr *)0x0) && (pFVar9->eType == 1)) {
          local_48._0_4_ = pFVar12->pPhrase->nToken;
          do {
            uVar6 = fts3EvalNearTrim(pFVar9->nNear,pcVar8,&local_40,(int *)&local_48,
                                     pFVar9->pRight->pPhrase);
            if ((uVar6 == 0) || (pFVar9 = pFVar9->pParent, pFVar9 == (Fts3Expr *)0x0)) break;
          } while (pFVar9->eType == 1);
        }
        pFVar1 = pExpr->pRight->pPhrase;
        local_40 = (pFVar1->doclist).pList;
        local_48 = (char *)CONCAT44(local_48._4_4_,pFVar1->nToken);
        pFVar12 = pExpr->pLeft;
        if (uVar6 != 0 && pFVar12 != (Fts3Expr *)0x0) {
          do {
            pFVar9 = pFVar12;
            if (pFVar12->eType == 1) {
              pFVar9 = pFVar12->pRight;
            }
            uVar6 = fts3EvalNearTrim(pFVar12->pParent->nNear,pcVar8,&local_40,(int *)&local_48,
                                     pFVar9->pPhrase);
            pFVar12 = pFVar12->pLeft;
          } while ((pFVar12 != (Fts3Expr *)0x0) && (uVar6 != 0));
        }
      }
      sqlite3_free(pcVar8);
    }
    if (((uVar6 == 0) && (uVar6 = 0, pExpr->eType == 1)) &&
       ((pExpr->pParent == (Fts3Expr *)0x0 || (pExpr->pParent->eType != 1)))) {
      pFVar1 = pExpr->pPhrase;
      while (pFVar1 == (Fts3Phrase *)0x0) {
        if (pExpr->pRight->iDocid == pCsr->iPrevId) {
          pFVar1 = pExpr->pRight->pPhrase;
          if ((pFVar1->doclist).bFreeList != 0) {
            sqlite3_free((pFVar1->doclist).pList);
          }
          (pFVar1->doclist).pList = (char *)0x0;
          (pFVar1->doclist).nList = 0;
          (pFVar1->doclist).bFreeList = 0;
        }
        pExpr = pExpr->pLeft;
        pFVar1 = pExpr->pPhrase;
      }
      if (pExpr->iDocid == pCsr->iPrevId) {
        if ((pFVar1->doclist).bFreeList != 0) {
          sqlite3_free((pFVar1->doclist).pList);
        }
        (pFVar1->doclist).pList = (char *)0x0;
        uVar6 = 0;
        (pFVar1->doclist).nList = 0;
        (pFVar1->doclist).bFreeList = 0;
      }
    }
    break;
  case 2:
    iVar7 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
    if (iVar7 == 0) {
      uVar6 = 0;
    }
    else {
      iVar7 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc);
      uVar6 = (uint)(iVar7 == 0);
    }
    break;
  case 4:
    iVar7 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
    iVar5 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc);
    uVar6 = (uint)(iVar5 != 0 || iVar7 != 0);
    break;
  default:
    if ((pCsr->pDeferred == (Fts3DeferredToken *)0x0) ||
       ((pExpr->bDeferred == '\0' &&
        ((pExpr->iDocid != pCsr->iPrevId || ((pExpr->pPhrase->doclist).pList == (char *)0x0)))))) {
      uVar6 = 0;
      if ((pExpr->bEof == '\0') && (pExpr->iDocid == pCsr->iPrevId)) {
        uVar6 = (uint)(0 < (pExpr->pPhrase->doclist).nList);
      }
      break;
    }
    pFVar1 = pExpr->pPhrase;
    if (pExpr->bDeferred != '\0') {
      if ((pFVar1->doclist).bFreeList != 0) {
        sqlite3_free((pFVar1->doclist).pList);
      }
      (pFVar1->doclist).pList = (char *)0x0;
      (pFVar1->doclist).nList = 0;
      (pFVar1->doclist).bFreeList = 0;
    }
    if ((pFVar1->doclist).bFreeList == 0) {
      pcVar8 = (char *)0x0;
    }
    else {
      pcVar8 = (pFVar1->doclist).pList;
    }
    if (pFVar1->nToken < 1) {
      local_68._0_4_ = 0;
      local_90 = -1;
      local_80 = (char *)0x0;
    }
    else {
      ppFVar10 = &pFVar1->aToken[0].pDeferred;
      local_90 = -1;
      lVar11 = 0;
      local_80 = (char *)0x0;
      local_68 = 0;
      do {
        pFVar2 = *ppFVar10;
        iVar7 = local_90;
        if (pFVar2 == (Fts3DeferredToken *)0x0) {
          bVar13 = true;
        }
        else {
          local_40 = &DAT_aaaaaaaaaaaaaaaa;
          bVar13 = true;
          if (pFVar2->pList == (PendingList *)0x0) {
            __dest = (char *)0x0;
            __n = 0;
            iVar5 = 0;
          }
          else {
            iVar5 = pFVar2->pList->nData;
            iVar4 = sqlite3_initialize();
            if (iVar4 == 0) {
              __dest = (char *)sqlite3Malloc((long)iVar5);
            }
            else {
              __dest = (char *)0x0;
            }
            bVar13 = __dest == (char *)0x0;
            if (bVar13) {
              iVar5 = 7;
              __dest = (char *)0x0;
              __n = 0;
            }
            else {
              iVar5 = sqlite3Fts3GetVarintU(pFVar2->pList->aData,(sqlite_uint64 *)&local_40);
              __n = (long)pFVar2->pList->nData - (long)iVar5;
              memcpy(__dest,pFVar2->pList->aData + iVar5,__n);
              iVar5 = 0;
            }
            bVar13 = !bVar13;
          }
          if (bVar13) {
            if (__dest == (char *)0x0) {
              sqlite3_free(local_80);
              sqlite3_free(pcVar8);
              (pFVar1->doclist).pList = (char *)0x0;
              (pFVar1->doclist).nList = 0;
              bVar13 = false;
              local_8c = 0;
            }
            else {
              iVar7 = (int)lVar11;
              if (local_80 == (char *)0x0) {
                bVar13 = true;
                local_80 = __dest;
                local_68 = __n;
              }
              else {
                local_48 = local_80;
                local_50 = __dest;
                local_40 = __dest;
                fts3PoslistPhraseMerge(&local_40,iVar7 - local_90,0,1,&local_48,&local_50);
                sqlite3_free(local_80);
                uVar6 = (int)local_40 - (int)__dest;
                local_68 = (ulong)uVar6;
                bVar13 = uVar6 != 0;
                local_80 = __dest;
                if (uVar6 == 0) {
                  sqlite3_free(__dest);
                  sqlite3_free(pcVar8);
                  (pFVar1->doclist).pList = (char *)0x0;
                  (pFVar1->doclist).nList = 0;
                  local_8c = 0;
                  iVar7 = local_90;
                }
              }
            }
          }
          else {
            bVar13 = false;
            local_8c = iVar5;
          }
        }
        local_90 = iVar7;
        if (!bVar13) goto LAB_001cfa68;
        lVar11 = lVar11 + 1;
        ppFVar10 = ppFVar10 + 5;
      } while (lVar11 < pFVar1->nToken);
    }
    if (local_90 < 0) {
LAB_001cfa50:
      local_8c = 0;
      if ((pFVar1->doclist).pList != pcVar8) {
        sqlite3_free(pcVar8);
      }
    }
    else {
      iVar7 = pFVar1->iDoclistToken;
      if (iVar7 < 0) {
        (pFVar1->doclist).pList = local_80;
        (pFVar1->doclist).nList = (int)local_68;
        (pFVar1->doclist).iDocid = pCsr->iPrevId;
        (pFVar1->doclist).bFreeList = 1;
        bVar13 = true;
      }
      else {
        local_50 = &DAT_aaaaaaaaaaaaaaaa;
        iVar5 = iVar7 - local_90;
        if (iVar5 == 0 || iVar7 < local_90) {
          local_40 = (pFVar1->doclist).pList;
          local_48 = local_80;
          iVar5 = local_90 - iVar7;
        }
        else {
          local_40 = local_80;
          local_48 = (pFVar1->doclist).pList;
        }
        local_50 = (char *)sqlite3Fts3MallocZero((long)((int)local_68 + 8));
        bVar13 = local_50 != (char *)0x0;
        if (local_50 == (char *)0x0) {
          local_8c = 7;
        }
        else {
          (pFVar1->doclist).pList = local_50;
          iVar4 = 0;
          iVar7 = fts3PoslistPhraseMerge(&local_50,iVar5,0,1,&local_40,&local_48);
          if (iVar7 == 0) {
            sqlite3_free(local_50);
            (pFVar1->doclist).pList = (char *)0x0;
          }
          else {
            (pFVar1->doclist).bFreeList = 1;
            iVar4 = (int)local_50 - *(int *)&(pFVar1->doclist).pList;
          }
          (pFVar1->doclist).nList = iVar4;
        }
        sqlite3_free(local_80);
      }
      if (bVar13) goto LAB_001cfa50;
    }
LAB_001cfa68:
    *pRc = local_8c;
    uVar6 = (uint)((pFVar1->doclist).pList != (char *)0x0);
    pExpr->iDocid = pCsr->iPrevId;
  }
LAB_001cf32b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar6;
}

Assistant:

static int fts3EvalTestExpr(
  Fts3Cursor *pCsr,               /* FTS cursor handle */
  Fts3Expr *pExpr,                /* Expr to test. May or may not be root. */
  int *pRc                        /* IN/OUT: Error code */
){
  int bHit = 1;                   /* Return value */
  if( *pRc==SQLITE_OK ){
    switch( pExpr->eType ){
      case FTSQUERY_NEAR:
      case FTSQUERY_AND:
        bHit = (
            fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc)
         && fts3EvalTestExpr(pCsr, pExpr->pRight, pRc)
         && fts3EvalNearTest(pExpr, pRc)
        );

        /* If the NEAR expression does not match any rows, zero the doclist for
        ** all phrases involved in the NEAR. This is because the snippet(),
        ** offsets() and matchinfo() functions are not supposed to recognize
        ** any instances of phrases that are part of unmatched NEAR queries.
        ** For example if this expression:
        **
        **    ... MATCH 'a OR (b NEAR c)'
        **
        ** is matched against a row containing:
        **
        **        'a b d e'
        **
        ** then any snippet() should ony highlight the "a" term, not the "b"
        ** (as "b" is part of a non-matching NEAR clause).
        */
        if( bHit==0
         && pExpr->eType==FTSQUERY_NEAR
         && (pExpr->pParent==0 || pExpr->pParent->eType!=FTSQUERY_NEAR)
        ){
          Fts3Expr *p;
          for(p=pExpr; p->pPhrase==0; p=p->pLeft){
            if( p->pRight->iDocid==pCsr->iPrevId ){
              fts3EvalInvalidatePoslist(p->pRight->pPhrase);
            }
          }
          if( p->iDocid==pCsr->iPrevId ){
            fts3EvalInvalidatePoslist(p->pPhrase);
          }
        }

        break;

      case FTSQUERY_OR: {
        int bHit1 = fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc);
        int bHit2 = fts3EvalTestExpr(pCsr, pExpr->pRight, pRc);
        bHit = bHit1 || bHit2;
        break;
      }

      case FTSQUERY_NOT:
        bHit = (
            fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc)
         && !fts3EvalTestExpr(pCsr, pExpr->pRight, pRc)
        );
        break;

      default: {
#ifndef SQLITE_DISABLE_FTS4_DEFERRED
        if( pCsr->pDeferred && (pExpr->bDeferred || (
            pExpr->iDocid==pCsr->iPrevId && pExpr->pPhrase->doclist.pList
        ))){
          Fts3Phrase *pPhrase = pExpr->pPhrase;
          if( pExpr->bDeferred ){
            fts3EvalInvalidatePoslist(pPhrase);
          }
          *pRc = fts3EvalDeferredPhrase(pCsr, pPhrase);
          bHit = (pPhrase->doclist.pList!=0);
          pExpr->iDocid = pCsr->iPrevId;
        }else
#endif
        {
          bHit = (
              pExpr->bEof==0 && pExpr->iDocid==pCsr->iPrevId
           && pExpr->pPhrase->doclist.nList>0
          );
        }
        break;
      }
    }
  }
  return bHit;
}